

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constants.cpp
# Opt level: O1

Pointer __thiscall
dg::pta::LLVMPointerGraphBuilder::getConstantExprPointer
          (LLVMPointerGraphBuilder *this,ConstantExpr *CE)

{
  CastInst *I2P;
  raw_ostream *prVar1;
  Pointer PVar2;
  
  I2P = (CastInst *)llvm::ConstantExpr::getAsInstruction((Instruction *)CE);
  switch(I2P[0x10]) {
  case (CastInst)0x28:
    PVar2 = handleConstantAdd(this,(Instruction *)I2P);
    break;
  default:
    prVar1 = (raw_ostream *)llvm::errs();
    prVar1 = llvm::raw_ostream::operator<<(prVar1,"ERR: Unsupported ConstantExpr ");
    prVar1 = llvm::operator<<(prVar1,(Value *)CE);
    llvm::raw_ostream::operator<<(prVar1,"\n");
    abort();
  case (CastInst)0x2a:
  case (CastInst)0x2c:
  case (CastInst)0x2f:
    PVar2 = handleConstantArithmetic(this,(Instruction *)I2P);
    break;
  case (CastInst)0x34:
  case (CastInst)0x35:
  case (CastInst)0x36:
  case (CastInst)0x37:
  case (CastInst)0x38:
  case (CastInst)0x41:
    PVar2.offset.offset = _warn;
    PVar2.target = UnknownPointer;
    break;
  case (CastInst)0x3d:
    PVar2 = handleConstantGep(this,(GetElementPtrInst *)I2P);
    break;
  case (CastInst)0x42:
  case (CastInst)0x43:
  case (CastInst)0x4c:
    PVar2 = handleConstantBitCast(this,I2P);
    break;
  case (CastInst)0x4a:
    PVar2 = handleConstantPtrToInt(this,(PtrToIntInst *)I2P);
    break;
  case (CastInst)0x4b:
    PVar2 = handleConstantIntToPtr(this,(IntToPtrInst *)I2P);
  }
  llvm::Value::deleteValue();
  return PVar2;
}

Assistant:

Pointer
LLVMPointerGraphBuilder::getConstantExprPointer(const llvm::ConstantExpr *CE) {
    using namespace llvm;

    Pointer pointer(UNKNOWN_MEMORY, Offset::UNKNOWN);
    Instruction *Inst = const_cast<ConstantExpr *>(CE)->getAsInstruction();

    switch (Inst->getOpcode()) {
    case Instruction::GetElementPtr:
        pointer = handleConstantGep(cast<GetElementPtrInst>(Inst));
        break;
        // case Instruction::ExtractValue:
        // case Instruction::Select:
        break;
    case Instruction::BitCast:
    case Instruction::SExt:
    case Instruction::ZExt:
        pointer = handleConstantBitCast(cast<CastInst>(Inst));
        break;
    case Instruction::PtrToInt:
        pointer = handleConstantPtrToInt(cast<PtrToIntInst>(Inst));
        break;
    case Instruction::IntToPtr:
        pointer = handleConstantIntToPtr(cast<IntToPtrInst>(Inst));
        break;
    case Instruction::Add:
        pointer = handleConstantAdd(Inst);
        break;
    case Instruction::And:
    case Instruction::Or:
    case Instruction::Trunc:
    case Instruction::Shl:
    case Instruction::LShr:
    case Instruction::AShr:
        pointer = UnknownPointer;
        break;
    case Instruction::Sub:
    case Instruction::Mul:
    case Instruction::SDiv:
        pointer = handleConstantArithmetic(Inst);
        break;
    default:
        errs() << "ERR: Unsupported ConstantExpr " << *CE << "\n";
        abort();
    }

#if LLVM_VERSION_MAJOR < 5
    delete Inst;
#else
    Inst->deleteValue();
#endif
    return pointer;
}